

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O3

SRes Lzma2Dec_DecodeToDic
               (CLzma2Dec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  SizeT *pSVar1;
  UInt32 *pUVar2;
  SizeT SVar3;
  char cVar4;
  byte *pbVar5;
  byte bVar6;
  int __result__;
  SRes SVar7;
  ELzmaStatus EVar8;
  UInt32 UVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char cVar13;
  uint uVar14;
  UInt32 UVar15;
  byte bVar16;
  ulong uVar17;
  SizeT SVar18;
  uint uVar19;
  SizeT srcSizeCur;
  ulong local_68;
  SizeT local_60;
  ELzmaFinishMode local_54;
  ELzmaStatus *local_50;
  SizeT local_48;
  SizeT *local_40;
  byte *local_38;
  
  local_60 = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  SVar18 = local_60;
  uVar10 = p->state;
  local_48 = dicLimit;
  local_38 = src;
  local_40 = srcLen;
  local_54 = finishMode;
  local_50 = status;
joined_r0x0073581e:
  do {
    if (uVar10 == 8) {
LAB_00735820:
      *status = LZMA_STATUS_FINISHED_WITH_MARK;
      return 0;
    }
    if (uVar10 == 9) {
      return 1;
    }
    SVar3 = (p->decoder).dicPos;
    uVar17 = dicLimit - SVar3;
    if (uVar17 == 0 && finishMode == LZMA_FINISH_ANY) {
      *status = LZMA_STATUS_NOT_FINISHED;
      return 0;
    }
    if ((uVar10 & 0xfffffffe) == 6) {
      local_68 = SVar18 - *srcLen;
      uVar11 = (ulong)p->unpackSize;
      uVar12 = uVar11;
      if (uVar11 > uVar17) {
        uVar12 = uVar17;
      }
      bVar6 = p->control;
      if ((char)bVar6 < '\0') {
        if (uVar10 == 6) {
          bVar6 = bVar6 >> 5 & 3;
          if ((bVar6 != 3) && ((p->needInitDic != 0 || ((bVar6 == 0 && (p->needInitState != 0))))))
          goto LAB_00735cc9;
          LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar6 == 3),(uint)(bVar6 != 0));
          p->needInitDic = 0;
          p->needInitState = 0;
          p->state = 7;
        }
        pbVar5 = local_38;
        status = local_50;
        if (p->packSize < local_68) {
          local_68 = (ulong)p->packSize;
        }
        SVar7 = LzmaDec_DecodeToDic(&p->decoder,uVar12 + SVar3,local_38,&local_68,
                                    (uint)(uVar11 <= uVar17),local_50);
        *local_40 = *local_40 + local_68;
        UVar9 = p->packSize;
        p->packSize = UVar9 - (UInt32)local_68;
        SVar18 = (p->decoder).dicPos;
        UVar15 = ((int)SVar3 - (int)SVar18) + p->unpackSize;
        p->unpackSize = UVar15;
        if (SVar7 != 0) {
          return SVar7;
        }
        EVar8 = *status;
        if (EVar8 == LZMA_STATUS_NEEDS_MORE_INPUT) {
          return 0;
        }
        if (SVar3 == SVar18 && local_68 == 0) {
          if (((EVar8 != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) || (UVar15 != 0)) ||
             (UVar9 != (UInt32)local_68)) goto LAB_00735cc9;
          p->state = 0;
          EVar8 = *status;
        }
        local_38 = pbVar5 + local_68;
        if (EVar8 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) {
          *status = LZMA_STATUS_NOT_FINISHED;
        }
      }
      else {
        if (SVar18 == *srcLen) {
          *local_50 = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if (uVar10 == 6) {
          if (bVar6 == 1) {
            p->needInitState = 1;
            p->needInitProp = 1;
          }
          else if (p->needInitDic != 0) goto LAB_00735cc9;
          p->needInitDic = 0;
          LzmaDec_InitDicAndState(&p->decoder,(uint)(bVar6 == 1),0);
        }
        pbVar5 = local_38;
        if (uVar12 < local_68) {
          local_68 = uVar12;
        }
        uVar17 = local_68;
        if (local_68 == 0) {
LAB_00735cc9:
          p->state = 9;
          return 1;
        }
        memcpy((p->decoder).dic + (p->decoder).dicPos,local_38,local_68);
        pSVar1 = &(p->decoder).dicPos;
        *pSVar1 = *pSVar1 + uVar17;
        if ((p->decoder).checkDicSize == 0) {
          UVar15 = (p->decoder).prop.dicSize;
          UVar9 = (p->decoder).processedPos;
          if (UVar15 - UVar9 <= uVar17) {
            (p->decoder).checkDicSize = UVar15;
          }
        }
        else {
          UVar9 = (p->decoder).processedPos;
        }
        (p->decoder).processedPos = (int)uVar17 + UVar9;
        *local_40 = *local_40 + local_68;
        local_38 = pbVar5 + local_68;
        pUVar2 = &p->unpackSize;
        *pUVar2 = *pUVar2 - (int)local_68;
        uVar10 = 7;
        if (*pUVar2 == 0) {
          uVar10 = 0;
        }
        p->state = uVar10;
        status = local_50;
      }
      SVar18 = local_60;
      uVar10 = p->state;
      dicLimit = local_48;
      srcLen = local_40;
      finishMode = local_54;
      goto joined_r0x0073581e;
    }
    if (*srcLen == SVar18) {
      *status = LZMA_STATUS_NEEDS_MORE_INPUT;
      return 0;
    }
    *srcLen = *srcLen + 1;
    uVar19 = 9;
    if (uVar10 < 6) {
      bVar6 = *local_38;
      uVar14 = (uint)bVar6;
      switch(uVar10) {
      case 0:
        p->control = bVar6;
        if (bVar6 == 0) {
          p->state = 8;
          goto LAB_00735820;
        }
        if ((char)bVar6 < '\0') {
          p->unpackSize = (uVar14 & 0x1f) << 0x10;
        }
        else {
          if (2 < bVar6) break;
          p->unpackSize = 0;
        }
        uVar19 = 1;
        break;
      case 1:
        p->unpackSize = p->unpackSize | uVar14 << 8;
        uVar19 = 2;
        break;
      case 2:
        p->unpackSize = (uVar14 | p->unpackSize) + 1;
        uVar19 = (uint)(-1 < (char)p->control) * 3 + 3;
        break;
      case 3:
        p->packSize = uVar14 << 8;
        uVar19 = 4;
        break;
      case 4:
        p->packSize = (uVar14 | p->packSize) + 1;
        uVar19 = 5;
        if ((p->control & 0x40) == 0) {
          uVar19 = (uint)(p->needInitProp != 0) * 3 + 6;
        }
        break;
      case 5:
        if (bVar6 < 0xe1) {
          cVar4 = (char)(uVar14 / 9);
          bVar16 = bVar6 + cVar4 * -9;
          cVar13 = (char)(uVar14 * 0x6d >> 8);
          (p->decoder).prop.pb = (uint)((byte)(((byte)(bVar6 - cVar13) >> 1) + cVar13) >> 5);
          bVar6 = cVar4 + (char)((uVar14 / 9) * 0x34 >> 8) * -5;
          SVar18 = local_60;
          if ((uint)bVar6 + (uint)bVar16 < 5) {
            (p->decoder).prop.lc = (uint)bVar16;
            (p->decoder).prop.lp = (uint)bVar6;
            p->needInitProp = 0;
            uVar19 = 6;
          }
        }
      }
    }
    uVar10 = uVar19;
    if (dicLimit == SVar3) {
      uVar10 = 9;
    }
    p->state = uVar10;
    if (dicLimit == SVar3) {
      return 1;
    }
    local_38 = local_38 + 1;
    uVar10 = uVar19;
  } while( true );
}

Assistant:

SRes Lzma2Dec_DecodeToDic(CLzma2Dec *p, SizeT dicLimit,
    const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->state != LZMA2_STATE_FINISHED)
  {
    SizeT dicPos = p->decoder.dicPos;
    
    if (p->state == LZMA2_STATE_ERROR)
      return SZ_ERROR_DATA;
    
    if (dicPos == dicLimit && finishMode == LZMA_FINISH_ANY)
    {
      *status = LZMA_STATUS_NOT_FINISHED;
      return SZ_OK;
    }

    if (p->state != LZMA2_STATE_DATA && p->state != LZMA2_STATE_DATA_CONT)
    {
      if (*srcLen == inSize)
      {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      (*srcLen)++;
      p->state = Lzma2Dec_UpdateState(p, *src++);

      if (dicPos == dicLimit && p->state != LZMA2_STATE_FINISHED)
      {
        p->state = LZMA2_STATE_ERROR;
        return SZ_ERROR_DATA;
      }
      continue;
    }
    
    {
      SizeT destSizeCur = dicLimit - dicPos;
      SizeT srcSizeCur = inSize - *srcLen;
      ELzmaFinishMode curFinishMode = LZMA_FINISH_ANY;
      
      if (p->unpackSize <= destSizeCur)
      {
        destSizeCur = (SizeT)p->unpackSize;
        curFinishMode = LZMA_FINISH_END;
      }

      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if (*srcLen == inSize)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }

        if (p->state == LZMA2_STATE_DATA)
        {
          Bool initDic = (p->control == LZMA2_CONTROL_COPY_RESET_DIC);
          if (initDic)
            p->needInitProp = p->needInitState = True;
          else if (p->needInitDic)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->needInitDic = False;
          LzmaDec_InitDicAndState(&p->decoder, initDic, False);
        }

        if (srcSizeCur > destSizeCur)
          srcSizeCur = destSizeCur;

        if (srcSizeCur == 0)
        {
          p->state = LZMA2_STATE_ERROR;
          return SZ_ERROR_DATA;
        }

        LzmaDec_UpdateWithUncompressed(&p->decoder, src, srcSizeCur);

        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->unpackSize -= (UInt32)srcSizeCur;
        p->state = (p->unpackSize == 0) ? LZMA2_STATE_CONTROL : LZMA2_STATE_DATA_CONT;
      }
      else
      {
        SizeT outSizeProcessed;
        SRes res;

        if (p->state == LZMA2_STATE_DATA)
        {
          unsigned mode = LZMA2_GET_LZMA_MODE(p);
          Bool initDic = (mode == 3);
          Bool initState = (mode != 0);
          if ((!initDic && p->needInitDic) || (!initState && p->needInitState))
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          
          LzmaDec_InitDicAndState(&p->decoder, initDic, initState);
          p->needInitDic = False;
          p->needInitState = False;
          p->state = LZMA2_STATE_DATA_CONT;
        }
  
        if (srcSizeCur > p->packSize)
          srcSizeCur = (SizeT)p->packSize;
          
        res = LzmaDec_DecodeToDic(&p->decoder, dicPos + destSizeCur, src, &srcSizeCur, curFinishMode, status);
        
        src += srcSizeCur;
        *srcLen += srcSizeCur;
        p->packSize -= (UInt32)srcSizeCur;

        outSizeProcessed = p->decoder.dicPos - dicPos;
        p->unpackSize -= (UInt32)outSizeProcessed;

        RINOK(res);
        if (*status == LZMA_STATUS_NEEDS_MORE_INPUT)
          return res;

        if (srcSizeCur == 0 && outSizeProcessed == 0)
        {
          if (*status != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK
              || p->unpackSize != 0
              || p->packSize != 0)
          {
            p->state = LZMA2_STATE_ERROR;
            return SZ_ERROR_DATA;
          }
          p->state = LZMA2_STATE_CONTROL;
        }
        
        if (*status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
          *status = LZMA_STATUS_NOT_FINISHED;
      }
    }
  }
  
  *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return SZ_OK;
}